

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBarLayout::setAlignment(ToolBarLayout *this,Alignment a)

{
  bool bVar1;
  Int IVar2;
  QFlags<Qt::AlignmentFlag> local_48;
  QFlags<Qt::AlignmentFlag> local_44;
  QFlags<Qt::AlignmentFlag> local_40;
  Int local_3c;
  Int local_38;
  Int local_34;
  Int local_30;
  QFlags<Qt::AlignmentFlag> local_2c;
  QFlags<Qt::AlignmentFlag> local_28;
  QFlags<Qt::AlignmentFlag> local_24;
  Int local_20;
  Int local_1c;
  ToolBarLayout *local_18;
  ToolBarLayout *this_local;
  Alignment a_local;
  
  local_18 = this;
  this_local._4_4_ = a.i;
  local_2c = Qt::operator|(AlignLeading,AlignRight);
  local_28 = QFlags<Qt::AlignmentFlag>::operator|(&local_2c,AlignCenter);
  local_24 = QFlags<Qt::AlignmentFlag>::operator|(&local_28,AlignTop);
  local_20 = (Int)QFlags<Qt::AlignmentFlag>::operator|(&local_24,AlignBottom);
  local_1c = (Int)QFlags<Qt::AlignmentFlag>::operator&
                            ((QFlags<Qt::AlignmentFlag> *)((long)&this_local + 4),
                             (QFlags<Qt::AlignmentFlag>)local_20);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
  if (IVar2 != 0) {
    local_30 = (this->align).i;
    local_34 = this_local._4_4_;
    bVar1 = ::operator!=((QFlags<Qt::AlignmentFlag>)local_30,
                         (QFlags<Qt::AlignmentFlag>)this_local._4_4_);
    if (bVar1) {
      local_48 = Qt::operator|(AlignLeading,AlignRight);
      local_44 = QFlags<Qt::AlignmentFlag>::operator|(&local_48,AlignCenter);
      local_40 = QFlags<Qt::AlignmentFlag>::operator|(&local_44,AlignTop);
      local_3c = (Int)QFlags<Qt::AlignmentFlag>::operator|(&local_40,AlignBottom);
      local_38 = (Int)QFlags<Qt::AlignmentFlag>::operator&
                                ((QFlags<Qt::AlignmentFlag> *)((long)&this_local + 4),
                                 (QFlags<Qt::AlignmentFlag>)local_3c);
      (this->align).i = local_38;
      QLayout::update();
    }
  }
  return;
}

Assistant:

void
ToolBarLayout::setAlignment( Qt::Alignment a )
{
	if( a & ( Qt::AlignLeft | Qt::AlignRight | Qt::AlignCenter
				| Qt::AlignTop | Qt::AlignBottom ) )
	{
		if( align != a )
		{
			align = a & ( Qt::AlignLeft | Qt::AlignRight | Qt::AlignCenter
				| Qt::AlignTop | Qt::AlignBottom );

			update();
		}
	}
}